

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsValidation.cpp
# Opt level: O3

bool __thiscall
chrono::utils::ChValidation::Process(ChValidation *this,string *sim_filename,char delim)

{
  double dVar1;
  size_t sVar2;
  double *pdVar3;
  ChValidation *this_00;
  pointer pvVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  sVar2 = ReadDataFile(sim_filename,delim,&this->m_sim_headers,&this->m_sim_data);
  this->m_num_rows = sVar2;
  lVar8 = (long)(this->m_sim_headers).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_sim_headers).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  sVar2 = lVar8 >> 5;
  this->m_num_cols = sVar2;
  sVar2 = sVar2 - 1;
  pdVar3 = (this->m_L2_norms)._M_data;
  if ((this->m_L2_norms)._M_size != sVar2) {
    operator_delete(pdVar3);
    (this->m_L2_norms)._M_size = sVar2;
    pdVar3 = (double *)::operator_new(sVar2 * 8);
    (this->m_L2_norms)._M_data = pdVar3;
  }
  if (sVar2 != 0) {
    memset(pdVar3,0,(lVar8 >> 2 & 0xfffffffffffffff8U) - 8);
  }
  sVar5 = this->m_num_cols;
  pdVar3 = (this->m_RMS_norms)._M_data;
  sVar2 = sVar5 - 1;
  if ((this->m_RMS_norms)._M_size != sVar2) {
    operator_delete(pdVar3);
    (this->m_RMS_norms)._M_size = sVar2;
    pdVar3 = (double *)::operator_new(sVar2 * 8);
    (this->m_RMS_norms)._M_data = pdVar3;
  }
  if (sVar2 != 0) {
    memset(pdVar3,0,sVar5 * 8 - 8);
  }
  sVar5 = this->m_num_cols;
  this_00 = (ChValidation *)(this->m_INF_norms)._M_data;
  sVar2 = sVar5 - 1;
  if ((this->m_INF_norms)._M_size != sVar2) {
    operator_delete(this_00);
    (this->m_INF_norms)._M_size = sVar2;
    this_00 = (ChValidation *)::operator_new(sVar2 * 8);
    (this->m_INF_norms)._M_data = (double *)this_00;
  }
  if (sVar2 != 0) {
    memset(this_00,0,sVar5 * 8 - 8);
  }
  if (this->m_num_cols != 1) {
    pvVar4 = (this->m_sim_data).
             super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      uVar7 = uVar6 + 1;
      auVar10 = ZEXT816(0) << 0x40;
      sVar2 = pvVar4[uVar7]._M_size;
      if (sVar2 != 0) {
        dVar9 = pvVar4[uVar7]._M_data[sVar2 - 1];
        dVar9 = dVar9 * dVar9;
        for (; auVar10._8_8_ = 0, auVar10._0_8_ = dVar9, sVar2 != 1; sVar2 = sVar2 - 1) {
          dVar1 = pvVar4[uVar7]._M_data[sVar2 - 2];
          dVar9 = dVar9 + dVar1 * dVar1;
        }
      }
      if (auVar10._0_8_ < 0.0) {
        dVar9 = sqrt(auVar10._0_8_);
      }
      else {
        auVar10 = vsqrtsd_avx(auVar10,auVar10);
        dVar9 = auVar10._0_8_;
      }
      (this->m_L2_norms)._M_data[uVar6] = dVar9;
      dVar9 = RMSnorm(this_00,(this->m_sim_data).
                              super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar7);
      (this->m_RMS_norms)._M_data[uVar6] = dVar9;
      pvVar4 = (this->m_sim_data).
               super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      sVar2 = pvVar4[uVar7]._M_size;
      if (sVar2 == 0) {
        dVar9 = 0.0;
      }
      else {
        auVar13._8_8_ = 0x7fffffffffffffff;
        auVar13._0_8_ = 0x7fffffffffffffff;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *pvVar4[uVar7]._M_data;
        auVar10 = vandpd_avx(auVar11,auVar13);
        dVar9 = auVar10._0_8_;
        if (sVar2 != 1) {
          sVar5 = 1;
          do {
            auVar12._8_8_ = 0;
            auVar12._0_8_ = pvVar4[uVar7]._M_data[sVar5];
            sVar5 = sVar5 + 1;
            auVar11 = vandpd_avx(auVar12,auVar13);
            auVar10 = vmaxsd_avx(auVar11,auVar10);
            dVar9 = auVar10._0_8_;
          } while (sVar2 != sVar5);
        }
      }
      (this->m_INF_norms)._M_data[uVar6] = dVar9;
      uVar6 = uVar7;
    } while (uVar7 < this->m_num_cols - 1);
  }
  return true;
}

Assistant:

bool ChValidation::Process(const std::string& sim_filename,
                           char               delim)
{
  // Read the simulation results file.
  m_num_rows = ReadDataFile(sim_filename, delim, m_sim_headers, m_sim_data);
  m_num_cols = m_sim_headers.size();

  // Resize arrays of norms.
  m_L2_norms.resize(m_num_cols - 1);
  m_RMS_norms.resize(m_num_cols - 1);
  m_INF_norms.resize(m_num_cols - 1);

  // Calculate norms of the column vectors.
  for (size_t col = 0; col < m_num_cols - 1; col++) {
    m_L2_norms[col] = L2norm(m_sim_data[col + 1]);
    m_RMS_norms[col] = RMSnorm(m_sim_data[col + 1]);
    m_INF_norms[col] = INFnorm(m_sim_data[col + 1]);
  }

  return true;
}